

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

Maybe<capnp::compiler::Module_&> __thiscall
capnp::SchemaParser::ModuleImpl::importRelative(ModuleImpl *this,StringPtr importPath)

{
  SchemaParser *this_00;
  SchemaFile *pSVar1;
  Own<capnp::SchemaFile,_std::nullptr_t> *pOVar2;
  ModuleImpl *t;
  undefined8 in_RCX;
  SchemaFile *pSVar3;
  Own<capnp::SchemaFile,_std::nullptr_t> *importedFile;
  Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_> local_48;
  undefined1 local_38 [8];
  OwnOwn<capnp::SchemaFile,_std::nullptr_t> _importedFile96;
  ModuleImpl *this_local;
  StringPtr importPath_local;
  
  pSVar3 = (SchemaFile *)importPath.content.ptr;
  _importedFile96.value.ptr = pSVar3;
  pSVar1 = kj::Own<const_capnp::SchemaFile,_std::nullptr_t>::operator->
                     ((Own<const_capnp::SchemaFile,_std::nullptr_t> *)(pSVar3 + 2));
  (*pSVar1->_vptr_SchemaFile[2])(&local_48,pSVar1,importPath.content.size_,in_RCX);
  kj::_::readMaybe<capnp::SchemaFile,decltype(nullptr)>((_ *)local_38,&local_48);
  kj::Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_>::~Maybe(&local_48);
  pOVar2 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_38);
  if (pOVar2 == (Own<capnp::SchemaFile,_std::nullptr_t> *)0x0) {
    kj::Maybe<capnp::compiler::Module_&>::Maybe((Maybe<capnp::compiler::Module_&> *)this);
  }
  else {
    pOVar2 = kj::_::OwnOwn<capnp::SchemaFile,_std::nullptr_t>::operator*
                       ((OwnOwn<capnp::SchemaFile,_std::nullptr_t> *)local_38);
    this_00 = (SchemaParser *)pSVar3[1]._vptr_SchemaFile;
    pOVar2 = kj::mv<kj::Own<capnp::SchemaFile,decltype(nullptr)>>(pOVar2);
    t = getModuleImpl(this_00,pOVar2);
    kj::Maybe<capnp::compiler::Module_&>::Maybe
              ((Maybe<capnp::compiler::Module_&> *)this,&t->super_Module);
  }
  kj::_::OwnOwn<capnp::SchemaFile,_std::nullptr_t>::~OwnOwn
            ((OwnOwn<capnp::SchemaFile,_std::nullptr_t> *)local_38);
  return (Maybe<capnp::compiler::Module_&>)&this->super_Module;
}

Assistant:

kj::Maybe<Module&> importRelative(kj::StringPtr importPath) override {
    KJ_IF_SOME(importedFile, file->import(importPath)) {
      return parser.getModuleImpl(kj::mv(importedFile));
    } else {
      return kj::none;
    }